

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry-inl.h
# Opt level: O2

shared_ptr<spdlog::logger> __thiscall
spdlog::details::registry::get(registry *this,string_view logger_name)

{
  bool bVar1;
  char *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  pthread_mutex_t *__mutex;
  long *plVar2;
  basic_string_view<char,_std::char_traits<char>_> __y;
  shared_ptr<spdlog::logger> sVar3;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  
  __y._M_len = logger_name._M_str;
  __mutex = (pthread_mutex_t *)logger_name._M_len;
  std::mutex::lock((mutex *)&__mutex->__data);
  plVar2 = (long *)((long)__mutex + 0x88);
  do {
    plVar2 = (long *)*plVar2;
    if (plVar2 == (long *)0x0) {
      (this->logger_map_mutex_).super___mutex_base._M_mutex.__align = 0;
      *(undefined8 *)((long)&(this->logger_map_mutex_).super___mutex_base._M_mutex + 8) = 0;
      goto LAB_0029128b;
    }
    __y._M_str = in_RCX;
    __x._M_str = (char *)plVar2[1];
    __x._M_len = plVar2[2];
    bVar1 = std::operator==(__x,__y);
  } while (!bVar1);
  std::__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2> *)(plVar2 + 5));
LAB_0029128b:
  pthread_mutex_unlock(__mutex);
  sVar3.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<spdlog::logger>)
         sVar3.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SPDLOG_INLINE std::shared_ptr<logger> registry::get(std::string_view logger_name) {
    std::lock_guard<std::mutex> lock(logger_map_mutex_);
    for (const auto &[key, val] : loggers_) {
        if (key == logger_name) {
            return val;
        }
    }
    return nullptr;
}